

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::map_sequence
          (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__return_storage_ptr__,
          LongReadsMapper *this,NKmerIndex *nkindex,char *query_sequence_ptr,sgNodeID_t seq_id)

{
  bool bVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  uint64_t i;
  ulong __n;
  reference rVar5;
  allocator_type local_309;
  vector<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  read_kmers;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  node_matches;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> private_results;
  vector<unsigned_char,_std::allocator<unsigned_char>_> candidate_counts;
  vector<bool,_std::allocator<bool>_> kmer_in_assembly;
  StreamKmerFactory skf;
  
  private_results.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  private_results.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  private_results.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  KMerFactory::KMerFactory(&skf.super_KMerFactory,this->k);
  read_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  node_matches.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  read_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  read_kmers.
  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  node_matches.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  node_matches.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&candidate_counts,
             (((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x38) * 2,
             (allocator_type *)&kmer_in_assembly);
  StreamKmerFactory::produce_all_kmers(&skf,query_sequence_ptr,&read_kmers);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&kmer_in_assembly,
             (long)read_kmers.
                   super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)read_kmers.
                   super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_309);
  lVar4 = 8;
  for (__n = 0; __n < (ulong)((long)read_kmers.
                                    super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)read_kmers.
                                    super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    bVar1 = NKmerIndex::filter(nkindex,*(uint64_t *)
                                        (&(read_kmers.
                                           super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first + lVar4
                                        ));
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&kmer_in_assembly,__n);
    puVar2 = rVar5._M_p;
    if (bVar1) {
      uVar3 = rVar5._M_mask | *puVar2;
    }
    else {
      uVar3 = ~rVar5._M_mask & *puVar2;
    }
    *puVar2 = uVar3;
    lVar4 = lVar4 + 0x10;
  }
  get_all_kmer_matches(this,nkindex,&node_matches,&read_kmers,&kmer_in_assembly);
  count_candidates(this,&candidate_counts,&node_matches,
                   (uint32_t)
                   ((ulong)((long)read_kmers.
                                  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)read_kmers.
                                 super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  alignment_blocks(__return_storage_ptr__,this,(uint32_t)seq_id,&node_matches,
                   (uint32_t)
                   ((ulong)((long)read_kmers.
                                  super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)read_kmers.
                                 super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4),&candidate_counts)
  ;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&kmer_in_assembly.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&candidate_counts.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&node_matches);
  std::
  _Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>::
  ~_Vector_base(&read_kmers.
                 super__Vector_base<std::pair<bool,_unsigned_long>,_std::allocator<std::pair<bool,_unsigned_long>_>_>
               );
  std::_Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>::~_Vector_base
            (&private_results.super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<LongReadMapping> LongReadsMapper::map_sequence(const NKmerIndex &nkindex, const char * query_sequence_ptr, sgNodeID_t seq_id) {
    std::vector<LongReadMapping> private_results;

    StreamKmerFactory skf(k);
    std::vector<std::pair<bool, uint64_t>> read_kmers;
    std::vector<std::vector<std::pair<int32_t, int32_t>>> node_matches; //node, offset
    read_kmers.clear();

    std::vector<unsigned char> candidate_counts(sg.nodes.size()*2);
    skf.produce_all_kmers(query_sequence_ptr, read_kmers);

    std::vector<bool> kmer_in_assembly(read_kmers.size());

    for (uint64_t i = 0; i < read_kmers.size(); ++i) {
        kmer_in_assembly[i] = nkindex.filter(read_kmers[i].second);
    }
    get_all_kmer_matches(nkindex, node_matches, read_kmers, kmer_in_assembly);

    //========== 2. Find match candidates in fixed windows ==========

    count_candidates(candidate_counts, node_matches,read_kmers.size());

    //========== 3. Create alignment blocks from candidates ==========

    return alignment_blocks(seq_id,node_matches,read_kmers.size(), candidate_counts);

}